

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void lzma_sha256_update(uint8_t *buf,size_t size,lzma_check_state *check)

{
  ulong uVar1;
  ulong uVar2;
  
  while (size != 0) {
    uVar1 = (ulong)((uint)(check->state).sha256.size & 0x3f);
    uVar2 = 0x40 - uVar1;
    if (size <= uVar2) {
      uVar2 = size;
    }
    memcpy((void *)((long)&check->buffer + uVar1),buf,uVar2);
    buf = buf + uVar2;
    size = size - uVar2;
    uVar2 = uVar2 + (check->state).sha256.size;
    (check->state).sha256.size = uVar2;
    if ((uVar2 & 0x3f) == 0) {
      process(check);
    }
  }
  return;
}

Assistant:

extern void
lzma_sha256_update(const uint8_t *buf, size_t size, lzma_check_state *check)
{
	// Copy the input data into a properly aligned temporary buffer.
	// This way we can be called with arbitrarily sized buffers
	// (no need to be multiple of 64 bytes), and the code works also
	// on architectures that don't allow unaligned memory access.
	while (size > 0) {
		const size_t copy_start = check->state.sha256.size & 0x3F;
		size_t copy_size = 64 - copy_start;
		if (copy_size > size)
			copy_size = size;

		memcpy(check->buffer.u8 + copy_start, buf, copy_size);

		buf += copy_size;
		size -= copy_size;
		check->state.sha256.size += copy_size;

		if ((check->state.sha256.size & 0x3F) == 0)
			process(check);
	}

	return;
}